

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_mode_search_utils.h
# Opt level: O0

void prune_intra_mode_with_hog
               (MACROBLOCK *x,BLOCK_SIZE bsize,BLOCK_SIZE sb_size,float th,
               uint8_t *directional_mode_skip_mask,int is_chroma)

{
  long in_RCX;
  float in_XMM0_Da;
  UV_PREDICTION_MODE uv_mode;
  float scores [8];
  float hist [32];
  int plane;
  byte local_c9;
  float local_c8 [8];
  float local_a8 [10];
  float *in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff88;
  BLOCK_SIZE in_stack_ffffffffffffff8e;
  BLOCK_SIZE in_stack_ffffffffffffff8f;
  MACROBLOCK *in_stack_ffffffffffffff90;
  
  memset(local_a8,0,0x80);
  collect_hog_data(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8f,in_stack_ffffffffffffff8e,
                   in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  memset(local_c8,0,0x20);
  (*av1_nn_predict)(local_a8,&av1_intra_hog_model_nnconfig,1,local_c8);
  for (local_c9 = 1; local_c9 < 9; local_c9 = local_c9 + 1) {
    if (local_c8[(int)(local_c9 - 1)] <= in_XMM0_Da) {
      *(undefined1 *)(in_RCX + (ulong)local_c9) = 1;
    }
  }
  return;
}

Assistant:

static inline void prune_intra_mode_with_hog(
    const MACROBLOCK *x, BLOCK_SIZE bsize, BLOCK_SIZE sb_size, float th,
    uint8_t *directional_mode_skip_mask, int is_chroma) {
  const int plane = is_chroma ? AOM_PLANE_U : AOM_PLANE_Y;
  float hist[BINS] = { 0.0f };
  collect_hog_data(x, bsize, sb_size, plane, hist);

  // Make prediction for each of the mode
  float scores[DIRECTIONAL_MODES] = { 0.0f };
  av1_nn_predict(hist, &av1_intra_hog_model_nnconfig, 1, scores);
  for (UV_PREDICTION_MODE uv_mode = UV_V_PRED; uv_mode <= UV_D67_PRED;
       uv_mode++) {
    if (scores[uv_mode - UV_V_PRED] <= th) {
      directional_mode_skip_mask[uv_mode] = 1;
    }
  }
}